

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

_Bool parse_random(char *str,random_value_conflict *bonus)

{
  _Bool _Var1;
  ulong uVar2;
  unsigned_long uv;
  char *pe;
  wchar_t min_i;
  wchar_t i;
  wchar_t values [4];
  _Bool negative;
  random_value_conflict *bonus_local;
  char *str_local;
  
  values[3]._3_1_ = 0;
  memset(&min_i,0,0x10);
  pe._4_4_ = 0;
  pe._0_4_ = 1;
  bonus_local = (random_value_conflict *)str;
  if (*str == '-') {
    values[3]._3_1_ = 1;
    bonus_local = (random_value_conflict *)(str + 1);
  }
  while( true ) {
    while( true ) {
      for (; (char)bonus_local->base == 'd';
          bonus_local = (random_value_conflict *)((long)&bonus_local->base + 1)) {
        if (2 < pe._4_4_) {
          return false;
        }
        if (pe._4_4_ < 2) {
          pe._4_4_ = 2;
          i = L'\x01';
        }
        pe._0_4_ = 3;
      }
      if ((char)bonus_local->base != 'M') break;
      if (pe._4_4_ == 2) {
        return false;
      }
      pe._4_4_ = 3;
      pe._0_4_ = 4;
      bonus_local = (random_value_conflict *)((long)&bonus_local->base + 1);
    }
    uVar2 = strtoul((char *)bonus_local,(char **)&uv,10);
    if ((random_value_conflict *)uv == bonus_local) break;
    if ((0x7fffffff < uVar2) || ((char)bonus_local->base == '+')) {
      return false;
    }
    bonus_local = (random_value_conflict *)uv;
    if (pe._4_4_ == 0) {
      if (*(char *)uv == 'd') {
        pe._4_4_ = 1;
      }
      else {
        if (*(char *)uv != '+') {
          _Var1 = contains_only_spaces((char *)uv);
          min_i = (wchar_t)uVar2;
          if (!_Var1) {
            return false;
          }
          goto LAB_001db94d;
        }
        bonus_local = (random_value_conflict *)(uv + 1);
        pe._0_4_ = 3;
      }
    }
    else if (pe._4_4_ == 4) {
      return false;
    }
    (&min_i)[pe._4_4_] = (wchar_t)uVar2;
    pe._4_4_ = pe._4_4_ + 1;
  }
  _Var1 = contains_only_spaces((char *)bonus_local);
  if ((!_Var1) || (pe._4_4_ < (int)pe)) {
    return false;
  }
LAB_001db94d:
  bonus->base = min_i;
  bonus->dice = i;
  bonus->sides = values[0];
  bonus->m_bonus = values[1];
  if ((values[3]._3_1_ & 1) != 0) {
    bonus->base = -bonus->base;
    bonus->base = bonus->base - bonus->m_bonus;
    bonus->base = bonus->base - bonus->dice * (bonus->sides + L'\x01');
  }
  return true;
}

Assistant:

static bool parse_random(const char *str, random_value *bonus) {
	bool negative = false;
	/* base, number of dice, sides, and bonus */
	int values[4] = { 0, 0, 0, 0 };
	int i = 0, min_i = 1;

	/* Entire value may be negated */
	if (str[0] == '-') {
		negative = true;
		++str;
	}

	while (1) {
		if (*str == 'd') {
			if (i > 2) {
				return false;
			}
			if (i < 2) {
				i = 2;
				/*
				 * 'd' with no preceding number implies one die.
				 */
				values[1] = 1;
			}
			min_i = 3;
			++str;
		} else if (*str == 'M') {
			if (i == 2) {
				return false;
			}
			i = 3;
			min_i = 4;
			++str;
		} else {
			char *pe;
			unsigned long uv = strtoul(str, &pe, 10);

			if (pe == str) {
				/*
				 * Trailing garbage or not enough values are
				 * not accepted.
				 */
				if (!contains_only_spaces(str) || i < min_i) {
					return false;
				}
				break;
			} else if (uv > INT_MAX || *str == '+') {
				return false;
			}
			str = pe;
			if (i == 0) {
				if (*str == 'd') {
					i = 1;
				} else if (*str == '+') {
					++str;
					min_i = 3;
				} else {
					if (!contains_only_spaces(pe)) {
						return false;
					}
					values[0] = (int)uv;
					break;
				}
			} else if (i == 4) {
				return false;
			}
			values[i] = (int)uv;
			++i;
		}
	}

	/* Assign the values */
	bonus->base = values[0];
	bonus->dice = values[1];
	bonus->sides = values[2];
	bonus->m_bonus = values[3];

	/*
	 * Handle negation (the random components are always positive, so the
	 * base must be adjusted as necessary).
	 */
	if (negative) {
		bonus->base *= -1;
		bonus->base -= bonus->m_bonus;
		bonus->base -= bonus->dice * (bonus->sides + 1);
	}

	return true;
}